

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SingularFieldHelper<10>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  MessageLite **ppMVar1;
  CodedOutputStream *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  WriteTagTo<google::protobuf::io::CodedOutputStream>(md->tag,output);
  ppMVar1 = Get<google::protobuf::MessageLite_const*>(field);
  SerializeGroupTo<google::protobuf::io::CodedOutputStream>(*ppMVar1,md->ptr,output);
  WriteTagTo<google::protobuf::io::CodedOutputStream>(md->tag + 1,output);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeGroupTo(Get<const MessageLite*>(field),
                     static_cast<const SerializationTable*>(md.ptr), output);
    WriteTagTo(md.tag + 1, output);
  }